

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O2

void xml_print_node(lyout *out,int level,lyd_node *node,int toplevel,int options)

{
  LYS_NODE LVar1;
  lys_node *node_00;
  int iVar2;
  lys_module *plVar3;
  LY_ERR *pLVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  lyd_node *plVar8;
  int level_00;
  lyd_node **pplVar9;
  char *local_50;
  lyd_node *local_48;
  char *local_40;
  ulong local_38;
  
  uVar6 = (ulong)(uint)level;
  iVar2 = lyd_wd_toprint(node,options);
  if (iVar2 == 0) {
    return;
  }
  LVar1 = node->schema->nodetype;
  local_38 = uVar6;
  if (LVar1 == LYS_CONTAINER) goto LAB_001765d2;
  if (LVar1 == LYS_LEAF) {
    xml_print_leaf(out,level,node,toplevel,options);
    return;
  }
  if (LVar1 == LYS_LEAFLIST) {
    iVar2 = 0;
  }
  else {
    if (LVar1 != LYS_LIST) {
      if (LVar1 == LYS_ANYXML) {
LAB_00176627:
        if (toplevel == 0) {
          if ((node->parent == (lyd_node *)0x0) || (iVar2 = nscmp(node,node->parent), iVar2 != 0)) {
            plVar3 = lyd_node_module(node);
            uVar7 = (ulong)(level * 2 - 2);
            if (level == 0) {
              uVar7 = uVar6;
            }
            ly_print(out,"%*s<%s xmlns=\"%s\"",uVar7,"",node->schema->name,plVar3->ns);
          }
          else {
            uVar7 = (ulong)(level * 2 - 2);
            if (level == 0) {
              uVar7 = uVar6;
            }
            ly_print(out,"%*s<%s",uVar7,"",node->schema->name);
          }
        }
        else {
          plVar3 = lyd_node_module(node);
          uVar7 = (ulong)(level * 2 - 2);
          if (level == 0) {
            uVar7 = uVar6;
          }
          ly_print(out,"%*s<%s xmlns=\"%s\"",uVar7,"",node->schema->name,plVar3->ns);
          xml_print_ns(out,node,options);
        }
        xml_print_attrs(out,node,options);
        if ((node[1].schema == (lys_node *)0x0) ||
           ((*(int *)&node->child == 0 && (*(char *)&(node[1].schema)->name == '\0')))) {
          pcVar5 = "\n";
          if (level == 0) {
            pcVar5 = "";
          }
          ly_print(out,"/>%s",pcVar5);
        }
        else {
          ly_print(out,">");
          if (*(uint *)&node->child < 0x11) {
            plVar8 = node + 1;
            iVar2 = (int)local_38;
            switch(*(uint *)&node->child) {
            case 0:
              lyxml_dump_text(out,(char *)plVar8->schema);
              break;
            case 1:
            case 3:
            case 5:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_xml.c"
                            ,0x206,
                            "void xml_print_anydata(struct lyout *, int, const struct lyd_node *, int, int)"
                           );
            case 2:
              if ('\0' < ly_log_level) {
                ly_log(LY_LLWRN,"Unable to print anydata content (type %d) as XML.",2);
              }
              break;
            case 4:
              ly_print(out,"%s",plVar8->schema);
              break;
            case 8:
              iVar2 = 0x32;
              if ((int)local_38 == 0) {
                iVar2 = 0x10;
              }
              pcVar5 = "\n";
              if ((int)local_38 == 0) {
                pcVar5 = "";
              }
              lyxml_print_mem(&local_50,(lyxml_elem *)plVar8->schema,iVar2);
              ly_print(out,"%s%s",pcVar5,local_50);
              free(local_50);
              break;
            case 0x10:
              if (plVar8->schema != (lys_node *)0x0) {
                if ((int)local_38 != 0) {
                  ly_print(out,"\n");
                }
                level_00 = iVar2 + 1;
                if (iVar2 == 0) {
                  level_00 = 0;
                }
                while (node_00 = plVar8->schema, node_00 != (lys_node *)0x0) {
                  xml_print_node(out,level_00,(lyd_node *)node_00,0,options & 0xfffffefe);
                  plVar8 = (lyd_node *)&node_00->flags;
                }
              }
            }
          }
          pcVar5 = "\n";
          if ((int)local_38 == 0) {
            pcVar5 = "";
          }
          ly_print(out,"</%s>%s",node->schema->name,pcVar5);
        }
        return;
      }
      if ((LVar1 != LYS_NOTIF) && (LVar1 != LYS_RPC)) {
        if (LVar1 == LYS_ANYDATA) goto LAB_00176627;
        if (LVar1 != LYS_ACTION) {
          pLVar4 = ly_errno_location();
          *pLVar4 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_xml.c"
                 ,0x22b);
          return;
        }
      }
LAB_001765d2:
      if (toplevel == 0) {
        if ((node->parent == (lyd_node *)0x0) || (iVar2 = nscmp(node,node->parent), iVar2 != 0)) {
          plVar3 = lyd_node_module(node);
          uVar7 = (ulong)(level * 2 - 2);
          if (level == 0) {
            uVar7 = uVar6;
          }
          ly_print(out,"%*s<%s xmlns=\"%s\"",uVar7,"",node->schema->name,plVar3->ns);
        }
        else {
          uVar7 = (ulong)(level * 2 - 2);
          if (level == 0) {
            uVar7 = uVar6;
          }
          ly_print(out,"%*s<%s",uVar7,"",node->schema->name);
        }
      }
      else {
        plVar3 = lyd_node_module(node);
        uVar7 = (ulong)(level * 2 - 2);
        if (level == 0) {
          uVar7 = uVar6;
        }
        ly_print(out,"%*s<%s xmlns=\"%s\"",uVar7,"",node->schema->name,plVar3->ns);
        xml_print_ns(out,node,options);
      }
      xml_print_attrs(out,node,options);
      local_40 = "\n";
      if (level == 0) {
        local_40 = "";
      }
      if (node->child == (lyd_node *)0x0) {
        ly_print(out,"/>%s");
        return;
      }
      pplVar9 = &node->child;
      local_48 = node;
      ly_print(out,">%s");
      iVar2 = level + 1;
      if (level == 0) {
        iVar2 = 0;
      }
      while (plVar8 = *pplVar9, plVar8 != (lyd_node *)0x0) {
        xml_print_node(out,iVar2,plVar8,0,options);
        pplVar9 = &plVar8->next;
      }
      uVar6 = (ulong)((int)local_38 * 2 - 2);
      if ((int)local_38 == 0) {
        uVar6 = local_38 & 0xffffffff;
      }
      ly_print(out,"%*s</%s>%s",uVar6,"",local_48->schema->name,local_40);
      return;
    }
    iVar2 = 1;
  }
  xml_print_list(out,level,node,iVar2,toplevel,options);
  return;
}

Assistant:

void
xml_print_node(struct lyout *out, int level, const struct lyd_node *node, int toplevel, int options)
{
    if (!lyd_wd_toprint(node, options)) {
        return;
    }

    switch (node->schema->nodetype) {
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_CONTAINER:
        xml_print_container(out, level, node, toplevel, options);
        break;
    case LYS_LEAF:
        xml_print_leaf(out, level, node, toplevel, options);
        break;
    case LYS_LEAFLIST:
        xml_print_list(out, level, node, 0, toplevel, options);
        break;
    case LYS_LIST:
        xml_print_list(out, level, node, 1, toplevel, options);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        xml_print_anydata(out, level, node, toplevel, options);
        break;
    default:
        LOGINT;
        break;
    }
}